

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O2

void __thiscall sznet::net::KcpConnection::handleKcpClose(KcpConnection *this)

{
  StateE __args_1;
  self *psVar1;
  LogStream *this_00;
  char *str;
  SourceFile file;
  undefined1 local_1000 [8];
  KcpConnectionPtr guardThis;
  undefined1 local_30 [12];
  
  EventLoop::assertInLoopThread(this->m_loop);
  if (g_logLevel < 1) {
    Logger::SourceFile::SourceFile<104>
              ((SourceFile *)local_30,
               (char (*) [104])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpConnection.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_30._0_8_;
    file.m_size = local_30._8_4_;
    Logger::Logger((Logger *)local_1000,file,0x193,TRACE,"handleKcpClose");
    psVar1 = LogStream::operator<<((LogStream *)&guardThis,"fd = ");
    this_00 = LogStream::operator<<(psVar1,(this->m_udpSocket).m_sockfd);
    psVar1 = LogStream::operator<<(this_00," state = ");
    str = stateToString(this);
    LogStream::operator<<(psVar1,str);
    Logger::~Logger((Logger *)local_1000);
  }
  __args_1 = this->m_state;
  if (__args_1 - kDisconnecting < 3) {
    this->m_state = kDisconnected;
    EventLoop::cancel(this->m_loop,this->m_kcpUpdateTimerId);
    EventLoop::cancel(this->m_loop,this->m_verifyTimerId);
    std::__shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<sznet::net::KcpConnection,void>
              ((__shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2> *)local_1000,
               (__weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::operator()
              (&this->m_kcpConnectionCallback,(shared_ptr<sznet::net::KcpConnection> *)local_1000);
    std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>::operator()
              (&this->m_kcpCloseCallback,(shared_ptr<sznet::net::KcpConnection> *)local_1000,
               __args_1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&guardThis);
    return;
  }
  __assert_fail("m_state == kConnected || m_state == kConnecting || m_state == kDisconnecting",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpConnection.cpp"
                ,0x195,"void sznet::net::KcpConnection::handleKcpClose()");
}

Assistant:

void KcpConnection::handleKcpClose()
{
	m_loop->assertInLoopThread();
	LOG_TRACE << "fd = " << m_udpSocket.fd() << " state = " << stateToString();
	int oldState = implicit_cast<int>(m_state);
	assert(m_state == kConnected || m_state == kConnecting || m_state == kDisconnecting);
	// we don't close fd, leave it to dtor, so we can find leaks easily.
	setState(kDisconnected);
	
	// ���ͷ���
	m_loop->cancel(m_kcpUpdateTimerId);
	m_loop->cancel(m_verifyTimerId);

	// ��ֹ��ǰ�ͷţ����ɲ���Ԥ��������
	KcpConnectionPtr guardThis(shared_from_this());
	m_kcpConnectionCallback(guardThis);
	// must be the last line
	m_kcpCloseCallback(guardThis, oldState);
}